

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_type_traits.hpp
# Opt level: O1

bitset<256UL> *
jsoncons::
json_type_traits<jsoncons::basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>,_std::bitset<256UL>,_void>
::as(bitset<256UL> *__return_storage_ptr__,
    basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j)

{
  _WordT *p_Var1;
  pointer puVar2;
  pointer puVar3;
  type_conflict9 tVar4;
  bool bVar5;
  unsigned_long uVar6;
  system_error *psVar7;
  conv_error *this;
  ulong uVar8;
  basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_> *j_00;
  ulong uVar9;
  byte bVar10;
  byte bVar11;
  string_view_type sVar12;
  type tVar13;
  error_code __ec;
  error_code ec;
  error_code __ec_00;
  vector<unsigned_char,_std::allocator<unsigned_char>_> val;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_78;
  type local_58;
  error_code local_40;
  error_code local_30;
  error_code local_20;
  
  tVar4 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
          is_integer<unsigned_long>(j);
  if (tVar4) {
    uVar6 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::
            as_integer<unsigned_long>(j);
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = uVar6;
  }
  else {
    bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string(j);
    if (!bVar5) {
      bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_string(j);
      if (!bVar5) {
        this = (conv_error *)__cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>(&local_40,not_bitset);
        ec._4_4_ = 0;
        ec._M_value = local_40._M_value;
        ec._M_cat = local_40._M_cat;
        conv_error::conv_error(this,ec);
        __cxa_throw(this,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[2] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[3] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[0] = 0;
    (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w[1] = 0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    bVar5 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::is_byte_string(j);
    if (bVar5) {
      json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
      ::as<std::vector<unsigned_char,std::allocator<unsigned_char>>>
                (&local_58,
                 (json_type_traits<jsoncons::basic_json<char,jsoncons::sorted_policy,std::allocator<char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)j,j_00);
      puVar3 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
      puVar2 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      if (puVar2 != (pointer)0x0) {
        operator_delete(puVar2,(long)puVar3 - (long)puVar2);
      }
      if (local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_58.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_58.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      sVar12 = basic_json<char,_jsoncons::sorted_policy,_std::allocator<char>_>::as_string_view(j);
      tVar13 = decode_base16<char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                         (sVar12._M_str,sVar12._M_str + sVar12._M_len,&local_78);
      if (tVar13.ec != success) {
        psVar7 = (system_error *)__cxa_allocate_exception(0x58);
        std::error_code::error_code<jsoncons::conv_errc,void>(&local_20,not_bitset);
        __ec_00._4_4_ = 0;
        __ec_00._M_value = local_20._M_value;
        *(undefined ***)(psVar7 + 0x50) = &PTR__json_exception_00b58738;
        __ec_00._M_cat = local_20._M_cat;
        std::system_error::system_error(psVar7,__ec_00);
        *(undefined8 *)psVar7 = 0xb5b5d8;
        *(undefined8 *)(psVar7 + 0x50) = 0xb5b610;
        *(undefined8 *)(psVar7 + 0x20) = 0;
        *(undefined8 *)(psVar7 + 0x28) = 0;
        *(system_error **)(psVar7 + 0x30) = psVar7 + 0x40;
        *(undefined8 *)(psVar7 + 0x38) = 0;
        psVar7[0x40] = (system_error)0x0;
        __cxa_throw(psVar7,&conv_error::typeinfo,conv_error::~conv_error);
      }
    }
    uVar8 = 0;
    uVar9 = 0;
    bVar11 = 0;
    bVar10 = 0;
    do {
      if (bVar11 == 0) {
        if ((ulong)((long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                   (long)local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                         _M_impl.super__Vector_impl_data._M_start) <= uVar9) {
          psVar7 = (system_error *)__cxa_allocate_exception(0x58);
          std::error_code::error_code<jsoncons::conv_errc,void>(&local_30,not_bitset);
          __ec._4_4_ = 0;
          __ec._M_value = local_30._M_value;
          *(undefined ***)(psVar7 + 0x50) = &PTR__json_exception_00b58738;
          __ec._M_cat = local_30._M_cat;
          std::system_error::system_error(psVar7,__ec);
          *(undefined8 *)psVar7 = 0xb5b5d8;
          *(undefined8 *)(psVar7 + 0x50) = 0xb5b610;
          *(undefined8 *)(psVar7 + 0x20) = 0;
          *(undefined8 *)(psVar7 + 0x28) = 0;
          *(system_error **)(psVar7 + 0x30) = psVar7 + 0x40;
          *(undefined8 *)(psVar7 + 0x38) = 0;
          psVar7[0x40] = (system_error)0x0;
          __cxa_throw(psVar7,&conv_error::typeinfo,conv_error::~conv_error);
        }
        bVar10 = local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                 super__Vector_impl_data._M_start[uVar9];
        uVar9 = uVar9 + 1;
        bVar11 = 0x80;
      }
      if ((bVar11 & bVar10) != 0) {
        p_Var1 = (__return_storage_ptr__->super__Base_bitset<4UL>)._M_w + (uVar8 >> 6);
        *p_Var1 = *p_Var1 | 1L << ((byte)uVar8 & 0x3f);
      }
      bVar11 = bVar11 >> 1;
      uVar8 = uVar8 + 1;
    } while (uVar8 != 0x100);
    if (local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static std::bitset<N> as(const Json& j)
        {
            if (j.template is<uint64_t>())
            {
                auto bits = j.template as<uint64_t>();
                std::bitset<N> bs = static_cast<unsigned long long>(bits);
                return bs;
            }
            else if (j.is_byte_string() || j.is_string())
            {
                std::bitset<N> bs;
                std::vector<uint8_t> bits;
                if (j.is_byte_string())
                {
                    bits = j.template as<std::vector<uint8_t>>();
                }
                else
                {
                    jsoncons::string_view sv = j.as_string_view();
                    auto result = decode_base16(sv.begin(), sv.end(), bits);
                    if (result.ec != conv_errc::success)
                    {
                        JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                    }
                }
                std::uint8_t byte = 0;
                std::uint8_t mask  = 0;

                std::size_t pos = 0;
                for (std::size_t i = 0; i < N; ++i)
                {
                    if (mask == 0)
                    {
                        if (pos >= bits.size())
                        {
                            JSONCONS_THROW(conv_error(conv_errc::not_bitset));
                        }
                        byte = bits.at(pos++);
                        mask = 0x80;
                    }

                    if (byte & mask)
                    {
                        bs[i] = 1;
                    }

                    mask = static_cast<std::uint8_t>(mask >> 1);
                }
                return bs;
            }
            else
            {
                JSONCONS_THROW(conv_error(conv_errc::not_bitset));
            }
        }